

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool IsOne(expr_node *node)

{
  bool bVar1;
  
  if (((node == (expr_node *)0x0) || (node->type != '\x01')) ||
     (bVar1 = true, (node->value).integer != 1)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsOne(const expr_node* node)
{
    if (node == nullptr)
        return false;
    if (node->type == INT && node->value.integer == 1)
        return true;
    else
        return false;
}